

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint seglen;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i *palVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *result;
  __m256i *b;
  __m256i *b_00;
  __m256i *palVar19;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *palVar20;
  __m256i *palVar21;
  char cVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int32_t t;
  ulong size;
  __m256i *palVar31;
  ulong uVar32;
  __m256i *palVar33;
  char cVar34;
  int iVar35;
  char cVar36;
  uint uVar37;
  long lVar38;
  __m256i *palVar39;
  __m256i *palVar40;
  __m256i *palVar41;
  __m256i *ptr;
  __m256i *palVar42;
  __m256i *ptr_00;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar67 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  char cVar76;
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  int32_t column_len;
  undefined1 in_stack_fffffffffffffd28 [12];
  undefined4 in_stack_fffffffffffffd34;
  __m256i *ptr_01;
  __m256i *local_2b0;
  __m256i *local_2a8;
  int local_2a0;
  __m256i *local_298;
  undefined1 local_288 [32];
  __m256i *local_258;
  ulong local_250;
  __m256i *local_218;
  __m256i *local_1c8;
  __m256i *local_1a8;
  char local_188;
  undefined1 local_168 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar6 = (profile->profile8).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar37 = profile->s1Len;
        uVar29 = (ulong)uVar37;
        if ((int)uVar37 < 1) {
          parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_4();
        }
        else {
          local_250 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_3();
          }
          else if (open < 0) {
            parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_stats_rowcol_striped_profile_avx2_256_8_cold_1();
          }
          else {
            uVar28 = uVar29 + 0x1f;
            size = uVar28 >> 5;
            uVar32 = (ulong)(uVar37 - 1) % size;
            uVar16 = (uint)((uVar37 - 1) / size);
            pvVar8 = (profile->profile8).matches;
            pvVar9 = (profile->profile8).similar;
            iVar18 = ppVar7->max;
            result = parasail_result_new_rowcol3((uint)uVar28 & 0x7fffffe0,s2Len);
            if (result != (parasail_result_t *)0x0) {
              result->flag = result->flag | 0x20150804;
              b = parasail_memalign___m256i(0x20,size);
              local_2b0 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              palVar19 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              local_1a8 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              local_1c8 = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              b_05 = parasail_memalign___m256i(0x20,size);
              b_06 = parasail_memalign___m256i(0x20,size);
              local_298 = parasail_memalign___m256i(0x20,size);
              palVar20 = parasail_memalign___m256i(0x20,size);
              local_2a8 = parasail_memalign___m256i(0x20,size);
              palVar21 = parasail_memalign___m256i(0x20,size);
              auVar66._8_8_ = 0;
              auVar66._0_8_ = b;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = local_2b0;
              auVar66 = vpunpcklqdq_avx(auVar66,auVar68);
              auVar45._8_8_ = 0;
              auVar45._0_8_ = b_00;
              auVar50._8_8_ = 0;
              auVar50._0_8_ = palVar19;
              auVar68 = vpunpcklqdq_avx(auVar45,auVar50);
              auVar45 = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar66;
              auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = b_01;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = local_1a8;
              auVar66 = vpunpcklqdq_avx(auVar51,auVar56);
              auVar57._8_8_ = 0;
              auVar57._0_8_ = b_02;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = local_1c8;
              auVar68 = vpunpcklqdq_avx(auVar57,auVar62);
              auVar51 = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar66;
              auVar56 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = b_03;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = b_04;
              auVar66 = vpunpcklqdq_avx(auVar61,auVar63);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = b_05;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = b_06;
              auVar68 = vpunpcklqdq_avx(auVar64,auVar69);
              auVar57 = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar66;
              auVar61 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = local_298;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = palVar20;
              auVar66 = vpunpcklqdq_avx(auVar65,auVar70);
              auVar71._8_8_ = 0;
              auVar71._0_8_ = local_2a8;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = palVar21;
              auVar68 = vpunpcklqdq_avx(auVar71,auVar73);
              auVar66 = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar66;
              auVar68 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
              auVar46._0_8_ = -(ulong)(auVar45._0_8_ == 0);
              auVar46._8_8_ = -(ulong)(auVar45._8_8_ == 0);
              auVar46._16_8_ = -(ulong)(auVar50._0_8_ == 0);
              auVar46._24_8_ = -(ulong)(auVar50._8_8_ == 0);
              auVar52._0_8_ = -(ulong)(auVar51._0_8_ == 0);
              auVar52._8_8_ = -(ulong)(auVar51._8_8_ == 0);
              auVar52._16_8_ = -(ulong)(auVar56._0_8_ == 0);
              auVar52._24_8_ = -(ulong)(auVar56._8_8_ == 0);
              auVar46 = vpackssdw_avx2(auVar46,auVar52);
              auVar52 = vpermq_avx2(auVar46,0xd8);
              auVar55._0_8_ = -(ulong)(auVar57._0_8_ == 0);
              auVar55._8_8_ = -(ulong)(auVar57._8_8_ == 0);
              auVar55._16_8_ = -(ulong)(auVar61._0_8_ == 0);
              auVar55._24_8_ = -(ulong)(auVar61._8_8_ == 0);
              auVar58._0_8_ = -(ulong)(auVar66._0_8_ == 0);
              auVar58._8_8_ = -(ulong)(auVar66._8_8_ == 0);
              auVar58._16_8_ = -(ulong)(auVar68._0_8_ == 0);
              auVar58._24_8_ = -(ulong)(auVar68._8_8_ == 0);
              auVar46 = vpackssdw_avx2(auVar55,auVar58);
              auVar46 = vpermq_avx2(auVar46,0xd8);
              auVar46 = vpackssdw_avx2(auVar52,auVar46);
              if ((((((((((((((((auVar46 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar46 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar46 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar46 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar46 >> 0x7f,0) == '\0') &&
                        (auVar46 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar46 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar46 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar46 >> 0xbf,0) == '\0') &&
                    (auVar46 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar46 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar46 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar46[0x1f]) {
                uVar43 = (undefined1)open;
                uVar44 = (undefined1)gap;
                alVar2[1]._4_4_ = in_stack_fffffffffffffd34;
                alVar2._0_12_ = in_stack_fffffffffffffd28;
                alVar2[2] = (longlong)b_02;
                alVar2[3] = (longlong)palVar21;
                parasail_memset___m256i(b,alVar2,size);
                alVar3[1]._4_4_ = in_stack_fffffffffffffd34;
                alVar3._0_12_ = in_stack_fffffffffffffd28;
                alVar3[2] = (longlong)b_02;
                alVar3[3] = (longlong)palVar21;
                parasail_memset___m256i(b_00,alVar3,size);
                alVar4[1]._4_4_ = in_stack_fffffffffffffd34;
                alVar4._0_12_ = in_stack_fffffffffffffd28;
                alVar4[2] = (longlong)b_02;
                alVar4[3] = (longlong)palVar21;
                parasail_memset___m256i(b_01,alVar4,size);
                alVar5[1]._4_4_ = in_stack_fffffffffffffd34;
                alVar5._0_12_ = in_stack_fffffffffffffd28;
                alVar5[2] = (longlong)b_02;
                alVar5[3] = (longlong)palVar21;
                parasail_memset___m256i(b_02,alVar5,size);
                c[1]._4_4_ = in_stack_fffffffffffffd34;
                c._0_12_ = in_stack_fffffffffffffd28;
                c[2] = (longlong)b_02;
                c[3] = (longlong)palVar21;
                parasail_memset___m256i(b_03,c,size);
                c_00[1]._4_4_ = in_stack_fffffffffffffd34;
                c_00._0_12_ = in_stack_fffffffffffffd28;
                c_00[2] = (longlong)b_02;
                c_00[3] = (longlong)palVar21;
                parasail_memset___m256i(b_04,c_00,size);
                c_01[1]._4_4_ = in_stack_fffffffffffffd34;
                c_01._0_12_ = in_stack_fffffffffffffd28;
                c_01[2] = (longlong)b_02;
                c_01[3] = (longlong)palVar21;
                parasail_memset___m256i(b_05,c_01,size);
                c_02[1]._4_4_ = in_stack_fffffffffffffd34;
                c_02._0_12_ = in_stack_fffffffffffffd28;
                c_02[2] = (longlong)b_02;
                c_02[3] = (longlong)palVar21;
                parasail_memset___m256i(b_06,c_02,size);
                seglen = (uint)size;
                uVar23 = seglen - 1;
                local_188 = (char)iVar18;
                auVar59[8] = 0x80;
                auVar59._0_8_ = 0x8080808080808080;
                auVar59[9] = 0x80;
                auVar59[10] = 0x80;
                auVar59[0xb] = 0x80;
                auVar59[0xc] = 0x80;
                auVar59[0xd] = 0x80;
                auVar59[0xe] = 0x80;
                auVar59[0xf] = 0x80;
                auVar59[0x10] = 0x80;
                auVar59[0x11] = 0x80;
                auVar59[0x12] = 0x80;
                auVar59[0x13] = 0x80;
                auVar59[0x14] = 0x80;
                auVar59[0x15] = 0x80;
                auVar59[0x16] = 0x80;
                auVar59[0x17] = 0x80;
                auVar59[0x18] = 0x80;
                auVar59[0x19] = 0x80;
                auVar59[0x1a] = 0x80;
                auVar59[0x1b] = 0x80;
                auVar59[0x1c] = 0x80;
                auVar59[0x1d] = 0x80;
                auVar59[0x1e] = 0x80;
                auVar59[0x1f] = 0x80;
                uVar17 = (uint)CONCAT71((uint7)(uint3)((uint)s2Len >> 8),0x80);
                auVar47[8] = 0x81;
                auVar47._0_8_ = 0x8181818181818181;
                auVar47[9] = 0x81;
                auVar47[10] = 0x81;
                auVar47[0xb] = 0x81;
                auVar47[0xc] = 0x81;
                auVar47[0xd] = 0x81;
                auVar47[0xe] = 0x81;
                auVar47[0xf] = 0x81;
                auVar47[0x10] = 0x81;
                auVar47[0x11] = 0x81;
                auVar47[0x12] = 0x81;
                auVar47[0x13] = 0x81;
                auVar47[0x14] = 0x81;
                auVar47[0x15] = 0x81;
                auVar47[0x16] = 0x81;
                auVar47[0x17] = 0x81;
                auVar47[0x18] = 0x81;
                auVar47[0x19] = 0x81;
                auVar47[0x1a] = 0x81;
                auVar47[0x1b] = 0x81;
                auVar47[0x1c] = 0x81;
                auVar47[0x1d] = 0x81;
                auVar47[0x1e] = 0x81;
                auVar47[0x1f] = 0x81;
                uVar26 = 0;
                uVar30 = 0;
                auVar46 = auVar47;
                auVar55 = auVar59;
                local_168 = auVar59;
                auVar52 = auVar59;
                do {
                  palVar42 = b_01;
                  palVar41 = b;
                  palVar39 = b_00;
                  palVar31 = b_02;
                  auVar45 = SUB3216(palVar41[uVar23],0);
                  auVar66 = auVar46._0_16_;
                  auVar74._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar66;
                  auVar68 = auVar46._16_16_;
                  auVar74._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar45;
                  auVar46 = vpalignr_avx2((undefined1  [32])palVar41[uVar23],auVar74,0xf);
                  auVar45 = SUB3216(palVar39[uVar23],0);
                  auVar77._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar66;
                  auVar77._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar45;
                  auVar58 = vpalignr_avx2((undefined1  [32])palVar39[uVar23],auVar77,0xf);
                  auVar45 = SUB3216(palVar42[uVar23],0);
                  auVar79._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar66;
                  auVar79._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar45;
                  auVar74 = vpalignr_avx2((undefined1  [32])palVar42[uVar23],auVar79,0xf);
                  auVar45 = SUB3216(palVar31[uVar23],0);
                  auVar81._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar66;
                  auVar81._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar45;
                  auVar66 = vpinsrb_avx(auVar46._0_16_,0x80,0);
                  auVar77 = vpalignr_avx2((undefined1  [32])palVar31[uVar23],auVar81,0xf);
                  auVar46 = vpblendd_avx2(auVar46,ZEXT1632(auVar66),0xf);
                  auVar66 = vpinsrb_avx(auVar58._0_16_,0x80,0);
                  auVar58 = vpblendd_avx2(auVar58,ZEXT1632(auVar66),0xf);
                  auVar66 = vpinsrb_avx(auVar74._0_16_,0x80,0);
                  auVar74 = vpblendd_avx2(auVar74,ZEXT1632(auVar66),0xf);
                  auVar66 = vpinsrb_avx(auVar77._0_16_,0x80,0);
                  auVar77 = vpblendd_avx2(auVar77,ZEXT1632(auVar66),0xf);
                  lVar25 = size * (long)ppVar7->mapper[(byte)s2[uVar26]] * 0x20;
                  iVar18 = (int)uVar26 + -2;
                  local_2a0 = (int)uVar30;
                  b = local_2b0;
                  b_01 = local_1a8;
                  palVar33 = palVar20;
                  palVar40 = palVar21;
                  b_02 = local_1c8;
                  b_00 = palVar19;
                  if (local_2a0 == iVar18) {
                    b = local_298;
                    b_01 = local_2a8;
                    palVar33 = palVar19;
                    palVar40 = local_1c8;
                    b_02 = palVar21;
                    b_00 = palVar20;
                  }
                  palVar21 = palVar40;
                  palVar20 = palVar33;
                  auVar84 = ZEXT3264(auVar47);
                  auVar82 = ZEXT3264(auVar59);
                  auVar83 = ZEXT3264(auVar59);
                  auVar78 = ZEXT3264(auVar59);
                  lVar38 = 0;
                  local_288 = auVar52;
                  do {
                    auVar52 = *(undefined1 (*) [32])((long)*b_03 + lVar38);
                    auVar79 = *(undefined1 (*) [32])((long)*b_04 + lVar38);
                    auVar81 = *(undefined1 (*) [32])((long)*b_05 + lVar38);
                    auVar1 = *(undefined1 (*) [32])((long)*b_06 + lVar38);
                    auVar46 = vpaddsb_avx2(auVar46,*(undefined1 (*) [32])
                                                    ((long)pvVar6 + lVar38 + lVar25));
                    auVar12 = vpmaxsb_avx2(auVar46,auVar52);
                    auVar60 = auVar82._0_32_;
                    auVar54 = vpmaxsb_avx2(auVar12,auVar60);
                    *(undefined1 (*) [32])((long)*b + lVar38) = auVar54;
                    auVar10 = vpcmpeqb_avx2(auVar54,auVar59);
                    auVar53 = vpcmpeqb_avx2(auVar46,auVar54);
                    auVar11 = vpcmpgtb_avx2(auVar12,auVar60);
                    auVar12 = vpblendvb_avx2(auVar78._0_32_,auVar79,auVar11);
                    auVar46 = vpaddsb_avx2(auVar58,*(undefined1 (*) [32])
                                                    ((long)pvVar8 + lVar38 + lVar25));
                    auVar46 = vpblendvb_avx2(auVar12,auVar46,auVar53);
                    auVar58 = vpblendvb_avx2(auVar46,auVar59,auVar10);
                    *(undefined1 (*) [32])((long)*b_00 + lVar38) = auVar58;
                    auVar12 = vpblendvb_avx2(auVar83._0_32_,auVar81,auVar11);
                    auVar46 = vpaddsb_avx2(auVar74,*(undefined1 (*) [32])
                                                    ((long)pvVar9 + lVar38 + lVar25));
                    auVar74 = vpblendvb_avx2(auVar12,auVar46,auVar53);
                    auVar12 = vpblendvb_avx2(auVar84._0_32_,auVar1,auVar11);
                    auVar11[8] = 1;
                    auVar11._0_8_ = 0x101010101010101;
                    auVar11[9] = 1;
                    auVar11[10] = 1;
                    auVar11[0xb] = 1;
                    auVar11[0xc] = 1;
                    auVar11[0xd] = 1;
                    auVar11[0xe] = 1;
                    auVar11[0xf] = 1;
                    auVar11[0x10] = 1;
                    auVar11[0x11] = 1;
                    auVar11[0x12] = 1;
                    auVar11[0x13] = 1;
                    auVar11[0x14] = 1;
                    auVar11[0x15] = 1;
                    auVar11[0x16] = 1;
                    auVar11[0x17] = 1;
                    auVar11[0x18] = 1;
                    auVar11[0x19] = 1;
                    auVar11[0x1a] = 1;
                    auVar11[0x1b] = 1;
                    auVar11[0x1c] = 1;
                    auVar11[0x1d] = 1;
                    auVar11[0x1e] = 1;
                    auVar11[0x1f] = 1;
                    auVar46 = vpaddsb_avx2(auVar77,auVar11);
                    auVar46 = vpblendvb_avx2(auVar12,auVar46,auVar53);
                    auVar74 = vpblendvb_avx2(auVar74,auVar59,auVar10);
                    *(undefined1 (*) [32])((long)*b_01 + lVar38) = auVar74;
                    auVar77 = vpblendvb_avx2(auVar46,auVar59,auVar10);
                    *(undefined1 (*) [32])((long)*b_02 + lVar38) = auVar77;
                    auVar46 = vpmaxsb_avx2(auVar58,local_288);
                    auVar12 = vpmaxsb_avx2(auVar74,auVar77);
                    auVar10 = vpmaxsb_avx2(auVar46,auVar12);
                    auVar12[1] = uVar43;
                    auVar12[0] = uVar43;
                    auVar12[2] = uVar43;
                    auVar12[3] = uVar43;
                    auVar12[4] = uVar43;
                    auVar12[5] = uVar43;
                    auVar12[6] = uVar43;
                    auVar12[7] = uVar43;
                    auVar12[8] = uVar43;
                    auVar12[9] = uVar43;
                    auVar12[10] = uVar43;
                    auVar12[0xb] = uVar43;
                    auVar12[0xc] = uVar43;
                    auVar12[0xd] = uVar43;
                    auVar12[0xe] = uVar43;
                    auVar12[0xf] = uVar43;
                    auVar12[0x10] = uVar43;
                    auVar12[0x11] = uVar43;
                    auVar12[0x12] = uVar43;
                    auVar12[0x13] = uVar43;
                    auVar12[0x14] = uVar43;
                    auVar12[0x15] = uVar43;
                    auVar12[0x16] = uVar43;
                    auVar12[0x17] = uVar43;
                    auVar12[0x18] = uVar43;
                    auVar12[0x19] = uVar43;
                    auVar12[0x1a] = uVar43;
                    auVar12[0x1b] = uVar43;
                    auVar12[0x1c] = uVar43;
                    auVar12[0x1d] = uVar43;
                    auVar12[0x1e] = uVar43;
                    auVar12[0x1f] = uVar43;
                    auVar53 = vpsubsb_avx2(auVar54,auVar12);
                    auVar14[1] = uVar44;
                    auVar14[0] = uVar44;
                    auVar14[2] = uVar44;
                    auVar14[3] = uVar44;
                    auVar14[4] = uVar44;
                    auVar14[5] = uVar44;
                    auVar14[6] = uVar44;
                    auVar14[7] = uVar44;
                    auVar14[8] = uVar44;
                    auVar14[9] = uVar44;
                    auVar14[10] = uVar44;
                    auVar14[0xb] = uVar44;
                    auVar14[0xc] = uVar44;
                    auVar14[0xd] = uVar44;
                    auVar14[0xe] = uVar44;
                    auVar14[0xf] = uVar44;
                    auVar14[0x10] = uVar44;
                    auVar14[0x11] = uVar44;
                    auVar14[0x12] = uVar44;
                    auVar14[0x13] = uVar44;
                    auVar14[0x14] = uVar44;
                    auVar14[0x15] = uVar44;
                    auVar14[0x16] = uVar44;
                    auVar14[0x17] = uVar44;
                    auVar14[0x18] = uVar44;
                    auVar14[0x19] = uVar44;
                    auVar14[0x1a] = uVar44;
                    auVar14[0x1b] = uVar44;
                    auVar14[0x1c] = uVar44;
                    auVar14[0x1d] = uVar44;
                    auVar14[0x1e] = uVar44;
                    auVar14[0x1f] = uVar44;
                    auVar11 = vpsubsb_avx2(auVar52,auVar14);
                    auVar12 = vpcmpgtb_avx2(auVar53,auVar11);
                    auVar79 = vpblendvb_avx2(auVar79,auVar58,auVar12);
                    auVar13[8] = 1;
                    auVar13._0_8_ = 0x101010101010101;
                    auVar13[9] = 1;
                    auVar13[10] = 1;
                    auVar13[0xb] = 1;
                    auVar13[0xc] = 1;
                    auVar13[0xd] = 1;
                    auVar13[0xe] = 1;
                    auVar13[0xf] = 1;
                    auVar13[0x10] = 1;
                    auVar13[0x11] = 1;
                    auVar13[0x12] = 1;
                    auVar13[0x13] = 1;
                    auVar13[0x14] = 1;
                    auVar13[0x15] = 1;
                    auVar13[0x16] = 1;
                    auVar13[0x17] = 1;
                    auVar13[0x18] = 1;
                    auVar13[0x19] = 1;
                    auVar13[0x1a] = 1;
                    auVar13[0x1b] = 1;
                    auVar13[0x1c] = 1;
                    auVar13[0x1d] = 1;
                    auVar13[0x1e] = 1;
                    auVar13[0x1f] = 1;
                    local_168 = vpmaxsb_avx2(auVar54,local_168);
                    auVar81 = vpblendvb_avx2(auVar81,auVar74,auVar12);
                    auVar46 = vpaddsb_avx2(auVar13,auVar1);
                    auVar52 = vpaddsb_avx2(auVar13,auVar77);
                    auVar46 = vpblendvb_avx2(auVar46,auVar52,auVar12);
                    auVar77 = vpmaxsb_avx2(auVar53,auVar11);
                    *(undefined1 (*) [32])((long)*b_03 + lVar38) = auVar77;
                    *(undefined1 (*) [32])((long)*b_04 + lVar38) = auVar79;
                    *(undefined1 (*) [32])((long)*b_05 + lVar38) = auVar81;
                    *(undefined1 (*) [32])((long)*b_06 + lVar38) = auVar46;
                    auVar79 = vpsubsb_avx2(auVar60,auVar14);
                    auVar77 = vpcmpgtb_avx2(auVar53,auVar79);
                    auVar46 = vpblendvb_avx2(auVar78._0_32_,auVar58,auVar77);
                    auVar78 = ZEXT3264(auVar46);
                    auVar46 = vpmaxsb_avx2(auVar53,auVar79);
                    auVar82 = ZEXT3264(auVar46);
                    auVar46 = vpblendvb_avx2(auVar83._0_32_,auVar74,auVar77);
                    auVar83 = ZEXT3264(auVar46);
                    auVar46 = vpaddsb_avx2(auVar84._0_32_,auVar13);
                    auVar46 = vpblendvb_avx2(auVar46,auVar52,auVar77);
                    auVar84 = ZEXT3264(auVar46);
                    auVar46 = *(undefined1 (*) [32])((long)*palVar41 + lVar38);
                    auVar58 = *(undefined1 (*) [32])((long)*palVar39 + lVar38);
                    auVar74 = *(undefined1 (*) [32])((long)*palVar42 + lVar38);
                    auVar77 = *(undefined1 (*) [32])((long)*palVar31 + lVar38);
                    lVar38 = lVar38 + 0x20;
                    local_288 = auVar10;
                  } while (size << 5 != lVar38);
                  local_288._0_8_ = local_2a8;
                  if (local_2a0 == iVar18) {
                    local_298 = local_2b0;
                    local_288._0_8_ = local_1a8;
                  }
                  iVar18 = 0;
                  auVar1[1] = uVar43;
                  auVar1[0] = uVar43;
                  auVar1[2] = uVar43;
                  auVar1[3] = uVar43;
                  auVar1[4] = uVar43;
                  auVar1[5] = uVar43;
                  auVar1[6] = uVar43;
                  auVar1[7] = uVar43;
                  auVar1[8] = uVar43;
                  auVar1[9] = uVar43;
                  auVar1[10] = uVar43;
                  auVar1[0xb] = uVar43;
                  auVar1[0xc] = uVar43;
                  auVar1[0xd] = uVar43;
                  auVar1[0xe] = uVar43;
                  auVar1[0xf] = uVar43;
                  auVar1[0x10] = uVar43;
                  auVar1[0x11] = uVar43;
                  auVar1[0x12] = uVar43;
                  auVar1[0x13] = uVar43;
                  auVar1[0x14] = uVar43;
                  auVar1[0x15] = uVar43;
                  auVar1[0x16] = uVar43;
                  auVar1[0x17] = uVar43;
                  auVar1[0x18] = uVar43;
                  auVar1[0x19] = uVar43;
                  auVar1[0x1a] = uVar43;
                  auVar1[0x1b] = uVar43;
                  auVar1[0x1c] = uVar43;
                  auVar1[0x1d] = uVar43;
                  auVar1[0x1e] = uVar43;
                  auVar1[0x1f] = uVar43;
                  auVar75 = ZEXT3264(auVar10);
                  auVar80 = ZEXT3264(local_168);
                  do {
                    alVar2 = palVar41[uVar23];
                    auVar66 = alVar2._0_16_;
                    auVar53._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar66;
                    auVar53._16_16_ = ZEXT116(0) * alVar2._16_16_ + ZEXT116(1) * auVar66;
                    auVar46 = vpalignr_avx2((undefined1  [32])alVar2,auVar53,0xf);
                    auVar66 = auVar46._0_16_;
                    auVar54._0_16_ = ZEXT116(0) * auVar82._0_16_ + ZEXT116(1) * auVar66;
                    auVar68 = auVar46._16_16_;
                    auVar54._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar82._0_16_;
                    auVar52 = vpalignr_avx2(auVar82._0_32_,auVar54,0xf);
                    auVar60._0_16_ = ZEXT116(0) * auVar78._0_16_ + ZEXT116(1) * auVar66;
                    auVar60._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar78._0_16_;
                    auVar58 = vpalignr_avx2(auVar78._0_32_,auVar60,0xf);
                    auVar67._0_16_ = ZEXT116(0) * auVar83._0_16_ + ZEXT116(1) * auVar66;
                    auVar67._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar83._0_16_;
                    auVar74 = vpalignr_avx2(auVar83._0_32_,auVar67,0xf);
                    auVar72._0_16_ = ZEXT116(0) * auVar84._0_16_ + ZEXT116(1) * auVar66;
                    auVar72._16_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar84._0_16_;
                    auVar77 = vpalignr_avx2(auVar84._0_32_,auVar72,0xf);
                    auVar66 = vpinsrb_avx(auVar66,0x80,0);
                    auVar68 = vpinsrb_avx(auVar52._0_16_,0x80,0);
                    auVar46 = vpblendd_avx2(auVar46,ZEXT1632(auVar66),0xf);
                    auVar75 = ZEXT3264(auVar75._0_32_);
                    auVar52 = vpblendd_avx2(auVar52,ZEXT1632(auVar68),0xf);
                    auVar82 = ZEXT3264(auVar52);
                    auVar66 = vpinsrb_avx(auVar58._0_16_,0x80,0);
                    auVar52 = vpblendd_avx2(auVar58,ZEXT1632(auVar66),0xf);
                    auVar78 = ZEXT3264(auVar52);
                    auVar66 = vpinsrb_avx(auVar74._0_16_,0x80,0);
                    auVar52 = vpblendd_avx2(auVar74,ZEXT1632(auVar66),0xf);
                    auVar83 = ZEXT3264(auVar52);
                    auVar66 = vpinsrb_avx(auVar77._0_16_,0x81,0);
                    auVar52 = vpblendd_avx2(auVar77,ZEXT1632(auVar66),0xf);
                    auVar84 = ZEXT3264(auVar52);
                    auVar10[1] = uVar44;
                    auVar10[0] = uVar44;
                    auVar10[2] = uVar44;
                    auVar10[3] = uVar44;
                    auVar10[4] = uVar44;
                    auVar10[5] = uVar44;
                    auVar10[6] = uVar44;
                    auVar10[7] = uVar44;
                    auVar10[8] = uVar44;
                    auVar10[9] = uVar44;
                    auVar10[10] = uVar44;
                    auVar10[0xb] = uVar44;
                    auVar10[0xc] = uVar44;
                    auVar10[0xd] = uVar44;
                    auVar10[0xe] = uVar44;
                    auVar10[0xf] = uVar44;
                    auVar10[0x10] = uVar44;
                    auVar10[0x11] = uVar44;
                    auVar10[0x12] = uVar44;
                    auVar10[0x13] = uVar44;
                    auVar10[0x14] = uVar44;
                    auVar10[0x15] = uVar44;
                    auVar10[0x16] = uVar44;
                    auVar10[0x17] = uVar44;
                    auVar10[0x18] = uVar44;
                    auVar10[0x19] = uVar44;
                    auVar10[0x1a] = uVar44;
                    auVar10[0x1b] = uVar44;
                    auVar10[0x1c] = uVar44;
                    auVar10[0x1d] = uVar44;
                    auVar10[0x1e] = uVar44;
                    auVar10[0x1f] = uVar44;
                    lVar38 = 0;
                    do {
                      auVar52 = vpaddsb_avx2(auVar46,*(undefined1 (*) [32])
                                                      ((long)pvVar6 + lVar38 + lVar25));
                      auVar46 = *(undefined1 (*) [32])((long)*b + lVar38);
                      auVar81 = auVar82._0_32_;
                      auVar79 = vpmaxsb_avx2(auVar46,auVar81);
                      *(undefined1 (*) [32])((long)*b + lVar38) = auVar79;
                      auVar52 = vpcmpeqb_avx2(auVar79,auVar52);
                      auVar46 = vpcmpgtb_avx2(auVar46,auVar81);
                      auVar46 = vpor_avx2(auVar52,auVar46);
                      auVar58 = vpblendvb_avx2(auVar78._0_32_,
                                               *(undefined1 (*) [32])((long)*b_00 + lVar38),auVar46)
                      ;
                      *(undefined1 (*) [32])((long)*b_00 + lVar38) = auVar58;
                      auVar74 = vpblendvb_avx2(auVar83._0_32_,
                                               *(undefined1 (*) [32])((long)*b_01 + lVar38),auVar46)
                      ;
                      *(undefined1 (*) [32])((long)*b_01 + lVar38) = auVar74;
                      auVar77 = vpblendvb_avx2(auVar84._0_32_,
                                               *(undefined1 (*) [32])((long)*b_02 + lVar38),auVar46)
                      ;
                      *(undefined1 (*) [32])((long)*b_02 + lVar38) = auVar77;
                      auVar46 = vpmaxsb_avx2(auVar75._0_32_,auVar58);
                      auVar52 = vpmaxsb_avx2(auVar74,auVar77);
                      auVar52 = vpmaxsb_avx2(auVar46,auVar52);
                      auVar75 = ZEXT3264(auVar52);
                      local_168 = vpmaxsb_avx2(auVar79,auVar80._0_32_);
                      auVar80 = ZEXT3264(local_168);
                      auVar12 = vpsubsb_avx2(auVar79,auVar1);
                      auVar53 = vpsubsb_avx2(auVar81,auVar10);
                      auVar82 = ZEXT3264(auVar53);
                      auVar79 = vpcmpgtb_avx2(auVar53,auVar12);
                      auVar46 = vpcmpeqb_avx2(auVar53,auVar12);
                      auVar81 = vpcmpgtb_avx2(auVar53,auVar59);
                      auVar46 = vpand_avx2(auVar46,auVar81);
                      auVar46 = vpor_avx2(auVar46,auVar79);
                      if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar46 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar46 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar46 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar46 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar46 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar46 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar46 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar46 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar46 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar46 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar46 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar46 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar46 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar46 >> 0x7f,0) == '\0') &&
                                        (auVar46 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar46 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar46 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar46 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar46 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar46 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar46 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar46 >> 0xbf,0) == '\0') &&
                                (auVar46 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar46 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar46 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar46 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar46 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar46 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar46 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar46[0x1f]) goto LAB_0085a88a;
                      auVar79 = vpcmpgtb_avx2(auVar12,auVar53);
                      auVar46 = vpblendvb_avx2(auVar78._0_32_,auVar58,auVar79);
                      auVar78 = ZEXT3264(auVar46);
                      auVar46 = vpblendvb_avx2(auVar83._0_32_,auVar74,auVar79);
                      auVar83 = ZEXT3264(auVar46);
                      auVar46 = vpaddsb_avx2(auVar84._0_32_,auVar13);
                      auVar58 = vpaddsb_avx2(auVar77,auVar13);
                      auVar46 = vpblendvb_avx2(auVar46,auVar58,auVar79);
                      auVar84 = ZEXT3264(auVar46);
                      auVar46 = *(undefined1 (*) [32])((long)*palVar41 + lVar38);
                      lVar38 = lVar38 + 0x20;
                    } while (size << 5 != lVar38);
                    iVar18 = iVar18 + 1;
                  } while (iVar18 != 0x20);
LAB_0085a88a:
                  alVar2 = b[uVar32];
                  cVar22 = alVar2[2]._7_1_;
                  alVar3 = b_00[uVar32];
                  cVar36 = alVar3[2]._7_1_;
                  alVar4 = b_01[uVar32];
                  cVar34 = alVar4[2]._7_1_;
                  alVar5 = b_02[uVar32];
                  cVar76 = alVar5[2]._7_1_;
                  if (uVar16 < 0x1f) {
                    iVar18 = 0;
                    do {
                      auVar46 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                0x28);
                      alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar46,0xf);
                      cVar22 = alVar2[2]._7_1_;
                      auVar46 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,
                                                0x28);
                      alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar46,0xf);
                      cVar36 = alVar3[2]._7_1_;
                      auVar46 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,
                                                0x28);
                      alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar46,0xf);
                      cVar34 = alVar4[2]._7_1_;
                      auVar46 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,
                                                0x28);
                      alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar46,0xf);
                      cVar76 = alVar5[2]._7_1_;
                      iVar18 = iVar18 + 1;
                    } while (iVar18 < (int)(0x1f - uVar16));
                  }
                  *(int *)(*((result->field_4).trace)->trace_del_table + uVar26 * 4) = cVar22 + 0x80
                  ;
                  *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 8) +
                          uVar26 * 4) = cVar36 + 0x80;
                  *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x10) +
                          uVar26 * 4) = cVar34 + 0x80;
                  *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x18) +
                          uVar26 * 4) = cVar76 + 0x80;
                  auVar46 = vpcmpgtb_avx2(local_168,auVar55);
                  local_2b0 = palVar41;
                  local_1a8 = palVar42;
                  local_1c8 = palVar31;
                  if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar46 >> 0x7f,0) != '\0')
                                    || (auVar46 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar46 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar46 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar46 >> 0xbf,0) != '\0') ||
                            (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar46[0x1f] < '\0') {
                    auVar46 = vpermq_avx2(local_168,0x44);
                    auVar46 = vpmaxsb_avx2(local_168,auVar46);
                    auVar55 = vpslldq_avx2(auVar46,8);
                    auVar46 = vpmaxsb_avx2(auVar46,auVar55);
                    auVar55 = vpslldq_avx2(auVar46,4);
                    auVar46 = vpmaxsb_avx2(auVar46,auVar55);
                    auVar55 = vpslldq_avx2(auVar46,2);
                    auVar46 = vpmaxsb_avx2(auVar46,auVar55);
                    auVar55 = vpslldq_avx2(auVar46,1);
                    auVar46 = vpmaxsb_avx2(auVar46,auVar55);
                    uVar17 = (uint)auVar46[0x17];
                    if ((char)('~' - local_188) < (char)auVar46[0x17]) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_250 = uVar26;
                      break;
                    }
                    auVar48[8] = 0xf;
                    auVar48._0_8_ = 0xf0f0f0f0f0f0f0f;
                    auVar48[9] = 0xf;
                    auVar48[10] = 0xf;
                    auVar48[0xb] = 0xf;
                    auVar48[0xc] = 0xf;
                    auVar48[0xd] = 0xf;
                    auVar48[0xe] = 0xf;
                    auVar48[0xf] = 0xf;
                    auVar48[0x10] = 0xf;
                    auVar48[0x11] = 0xf;
                    auVar48[0x12] = 0xf;
                    auVar48[0x13] = 0xf;
                    auVar48[0x14] = 0xf;
                    auVar48[0x15] = 0xf;
                    auVar48[0x16] = 0xf;
                    auVar48[0x17] = 0xf;
                    auVar48[0x18] = 0xf;
                    auVar48[0x19] = 0xf;
                    auVar48[0x1a] = 0xf;
                    auVar48[0x1b] = 0xf;
                    auVar48[0x1c] = 0xf;
                    auVar48[0x1d] = 0xf;
                    auVar48[0x1e] = 0xf;
                    auVar48[0x1f] = 0xf;
                    auVar46 = vpshufb_avx2(auVar46,auVar48);
                    auVar55 = vpermq_avx2(auVar46,0xaa);
                    uVar30 = uVar26 & 0xffffffff;
                  }
                  local_2a0 = (int)uVar30;
                  uVar26 = uVar26 + 1;
                  palVar19 = palVar39;
                  local_2a8 = (__m256i *)local_288._0_8_;
                } while (uVar26 != local_250);
                uVar32 = 0;
                do {
                  t = (int32_t)uVar32;
                  vH[1]._4_4_ = uVar17;
                  vH._0_12_ = in_stack_fffffffffffffd28;
                  vH[2] = (longlong)b_02;
                  vH[3] = (longlong)palVar21;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x20),
                                vH,t,seglen,(int32_t)uVar26);
                  vH_00[1]._4_4_ = uVar17;
                  vH_00._0_12_ = in_stack_fffffffffffffd28;
                  vH_00[2] = (longlong)b_02;
                  vH_00[3] = (longlong)palVar21;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x28),
                                vH_00,t,seglen,(int32_t)uVar26);
                  vH_01[1]._4_4_ = uVar17;
                  vH_01._0_12_ = in_stack_fffffffffffffd28;
                  vH_01[2] = (longlong)b_02;
                  vH_01[3] = (longlong)palVar21;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x30),
                                vH_01,t,seglen,(int32_t)uVar26);
                  vH_02[1]._4_4_ = uVar17;
                  vH_02._0_12_ = in_stack_fffffffffffffd28;
                  vH_02[2] = (longlong)b_02;
                  vH_02[3] = (longlong)palVar21;
                  arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x38),
                                vH_02,t,seglen,(int32_t)uVar26);
                  uVar32 = uVar32 + 1;
                } while (size != uVar32);
                if (((char)uVar17 == '\x7f') ||
                   (auVar49[8] = 0x7f, auVar49._0_8_ = 0x7f7f7f7f7f7f7f7f, auVar49[9] = 0x7f,
                   auVar49[10] = 0x7f, auVar49[0xb] = 0x7f, auVar49[0xc] = 0x7f, auVar49[0xd] = 0x7f
                   , auVar49[0xe] = 0x7f, auVar49[0xf] = 0x7f, auVar49[0x10] = 0x7f,
                   auVar49[0x11] = 0x7f, auVar49[0x12] = 0x7f, auVar49[0x13] = 0x7f,
                   auVar49[0x14] = 0x7f, auVar49[0x15] = 0x7f, auVar49[0x16] = 0x7f,
                   auVar49[0x17] = 0x7f, auVar49[0x18] = 0x7f, auVar49[0x19] = 0x7f,
                   auVar49[0x1a] = 0x7f, auVar49[0x1b] = 0x7f, auVar49[0x1c] = 0x7f,
                   auVar49[0x1d] = 0x7f, auVar49[0x1e] = 0x7f, auVar49[0x1f] = 0x7f,
                   auVar46 = vpcmpeqb_avx2(auVar49,auVar52),
                   (((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0 ||
                                                (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x77 & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) || SUB321(auVar46 >> 0x7f,0) != '\0') ||
                                 (auVar46 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar46 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                               (auVar46 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (auVar46 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                            || (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || (auVar46 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          SUB321(auVar46 >> 0xbf,0) != '\0') ||
                         (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   auVar46[0x1f] < '\0')) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                palVar19 = b_02;
                iVar18 = parasail_result_is_saturated(result);
                local_218 = palVar39;
                if (iVar18 == 0) {
                  palVar33 = b;
                  palVar40 = palVar20;
                  ptr = b_00;
                  ptr_00 = (__m256i *)local_288._0_8_;
                  ptr_01 = palVar21;
                  local_258 = local_298;
                  palVar15 = b_01;
                  if ((local_2a0 != (int)local_250 + -1) &&
                     (palVar33 = local_298, b_02 = palVar21, palVar40 = b_00, ptr = palVar20,
                     ptr_00 = b_01, ptr_01 = palVar19, local_258 = b,
                     palVar15 = (__m256i *)local_288._0_8_, local_2a0 == (int)local_250 + -2)) {
                    local_2b0 = local_298;
                    local_218 = palVar20;
                    local_1a8 = (__m256i *)local_288._0_8_;
                    palVar33 = palVar41;
                    local_1c8 = palVar21;
                    b_02 = palVar31;
                    ptr = palVar39;
                    palVar15 = palVar42;
                  }
                  local_288._0_8_ = palVar15;
                  if ((uVar28 & 0x7fffffe0) == 0) {
                    iVar18 = 0;
                    iVar24 = 0;
                    iVar27 = 0;
                  }
                  else {
                    cVar22 = -0x80;
                    uVar28 = 0;
                    cVar36 = -0x80;
                    cVar34 = -0x80;
                    do {
                      if ((*(char *)((long)*palVar33 + uVar28) == (char)uVar17) &&
                         (uVar37 = ((uint)uVar28 & 0x1f) * seglen +
                                   ((uint)(uVar28 >> 5) & 0x7ffffff), (int)uVar37 < (int)uVar29)) {
                        cVar22 = *(char *)((long)*ptr + uVar28);
                        cVar36 = *(char *)((long)(longlong *)local_288._0_8_ + uVar28);
                        cVar34 = *(char *)((long)*b_02 + uVar28);
                        uVar29 = (ulong)uVar37;
                      }
                      uVar37 = (uint)uVar29;
                      uVar28 = uVar28 + 1;
                    } while ((seglen & 0x3ffffff) << 5 != (int)uVar28);
                    iVar27 = cVar22 + 0x80;
                    iVar24 = cVar36 + 0x80;
                    iVar18 = cVar34 + 0x80;
                  }
                  iVar35 = (char)uVar17 + 0x80;
                }
                else {
                  local_2a0 = 0;
                  iVar18 = 0x80;
                  iVar24 = 0x80;
                  iVar27 = 0x80;
                  iVar35 = 0x80;
                  uVar37 = 0;
                  palVar33 = local_298;
                  b_02 = palVar21;
                  palVar40 = b_00;
                  ptr = palVar20;
                  ptr_00 = b_01;
                  ptr_01 = palVar19;
                  local_258 = b;
                }
                result->score = iVar35;
                result->end_query = uVar37;
                result->end_ref = local_2a0;
                ((result->field_4).stats)->matches = iVar27;
                ((result->field_4).stats)->similar = iVar24;
                ((result->field_4).stats)->length = iVar18;
                parasail_free(b_02);
                parasail_free((void *)local_288._0_8_);
                parasail_free(ptr);
                parasail_free(palVar33);
                parasail_free(b_06);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(local_1c8);
                parasail_free(ptr_01);
                parasail_free(local_1a8);
                parasail_free(ptr_00);
                parasail_free(local_218);
                parasail_free(palVar40);
                parasail_free(local_2b0);
                parasail_free(local_258);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int8_t bias = 0;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vBias;
    __m256i vBias1;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i insert_mask;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int8_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile8.score;
    vProfileM = (__m256i*)profile->profile8.matches;
    vProfileS = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    bias = INT8_MIN;
    score = bias;
    matches = bias;
    similar = bias;
    length = bias;
    vBias = _mm256_set1_epi8(bias);
    vBias1 = _mm256_adds_epi8(vBias,vOne);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    vSaturationCheckMax = vBias;
    vPosLimit = _mm256_set1_epi8(INT8_MAX);
    maxp = INT8_MAX - (int8_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvHMStore, vBias, segLen);
    parasail_memset___m256i(pvHSStore, vBias, segLen);
    parasail_memset___m256i(pvHLStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);
    parasail_memset___m256i(pvEM, vBias, segLen);
    parasail_memset___m256i(pvES, vBias, segLen);
    parasail_memset___m256i(pvEL, vBias1, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vBias;
        vFM = vBias;
        vFS = vBias;
        vFL = vBias1;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 1);
        vHM = _mm256_slli_si256_rpl(vHM, 1);
        vHS = _mm256_slli_si256_rpl(vHS, 1);
        vHL = _mm256_slli_si256_rpl(vHL, 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);
        vHM = _mm256_blendv_epi8(vHM, vBias, insert_mask);
        vHS = _mm256_blendv_epi8(vHS, vBias, insert_mask);
        vHL = _mm256_blendv_epi8(vHL, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            /*vH = _mm256_max_epi8(vH_dag, vBias);*/
            vH = _mm256_max_epi8(vH_dag, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi8(vH, vBias);

            case1 = _mm256_cmpeq_epi8(vH, vH_dag);
            case2 = _mm256_cmpeq_epi8(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_adds_epi8(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_blendv_epi8(vHM, vBias, cond_zero);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_adds_epi8(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_blendv_epi8(vHS, vBias, cond_zero);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_adds_epi8(vHL, vOne), case1);
            vHL = _mm256_blendv_epi8(vHL, vBias, cond_zero);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            vEF_opn = _mm256_subs_epi8(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vEL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vFL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 1);
            vF = _mm256_slli_si256_rpl(vF, 1);
            vFM = _mm256_slli_si256_rpl(vFM, 1);
            vFS = _mm256_slli_si256_rpl(vFS, 1);
            vFL = _mm256_slli_si256_rpl(vFL, 1);
            vHp = _mm256_blendv_epi8(vHp, vBias, insert_mask);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            vFM = _mm256_blendv_epi8(vFM, vBias, insert_mask);
            vFS = _mm256_blendv_epi8(vFS, vBias, insert_mask);
            vFL = _mm256_blendv_epi8(vFL, vBias1, insert_mask);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_adds_epi8(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH, vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi8(vH, vHp);
                case2 = _mm256_cmpeq_epi8(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_subs_epi8(vH, vGapO);
                vF_ext = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi8(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi8(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi8(vF_ext, vBias)))))
                    goto end;
                /*vF = _mm256_max_epi8(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_adds_epi8(vFL, vOne),
                        _mm256_adds_epi8(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31) - bias;
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31) - bias;
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen, bias);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen, bias);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen, bias);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi8(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int8_t *m = (int8_t*)pvHMMax;
            int8_t *s = (int8_t*)pvHSMax;
            int8_t *l = (int8_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches - bias;
    result->stats->similar = similar - bias;
    result->stats->length = length - bias;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}